

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void bitset_set_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  long lVar1;
  
  lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar1 + 4) & 0x20) != 0) {
    _asm_bitset_set_list(words,list,length);
    return;
  }
  if (length != 0) {
    lVar1 = 0;
    do {
      words[*(ushort *)((long)list + lVar1) >> 6] =
           words[*(ushort *)((long)list + lVar1) >> 6] |
           1L << ((byte)*(ushort *)((long)list + lVar1) & 0x3f);
      lVar1 = lVar1 + 2;
    } while (length * 2 != lVar1);
  }
  return;
}

Assistant:

void bitset_set_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    if( croaring_avx2() ) {
        _asm_bitset_set_list(words, list, length);
    } else {
        _scalar_bitset_set_list(words, list, length);
    }
}